

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseManager::GetDatabaseType
          (DatabaseManager *this,ClientContext *context,AttachInfo *info,DBConfig *config,
          AttachOptions *options)

{
  string *l1;
  bool bVar1;
  FileSystem *fs;
  allocator local_51;
  string local_50;
  
  l1 = &options->db_type;
  ::std::__cxx11::string::string((string *)&local_50,"DUCKDB",&local_51);
  bVar1 = StringUtil::CIEquals((string *)l1,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    ::std::__cxx11::string::assign((char *)l1);
  }
  else {
    if ((options->db_type)._M_string_length == 0) {
      CheckPathConflict(this,context,&info->path);
      fs = FileSystem::GetFileSystem(context);
      DBPathAndType::CheckMagicBytes(fs,&info->path,l1);
      if ((options->db_type)._M_string_length == 0) {
        return;
      }
    }
    bVar1 = Catalog::TryAutoLoad(context,l1);
    if (!bVar1) {
      ExtensionHelper::LoadExternalExtension(context,l1);
    }
  }
  return;
}

Assistant:

void DatabaseManager::GetDatabaseType(ClientContext &context, AttachInfo &info, const DBConfig &config,
                                      AttachOptions &options) {

	// Test if the database is a DuckDB database file.
	if (StringUtil::CIEquals(options.db_type, "DUCKDB")) {
		options.db_type = "";
		return;
	}

	// Try to extract the database type from the path.
	if (options.db_type.empty()) {
		CheckPathConflict(context, info.path);

		auto &fs = FileSystem::GetFileSystem(context);
		DBPathAndType::CheckMagicBytes(fs, info.path, options.db_type);
	}

	// If we are loading a database type from an extension, then we need to check if that extension is loaded.
	if (!options.db_type.empty()) {
		if (!Catalog::TryAutoLoad(context, options.db_type)) {
			// FIXME: Here it might be preferable to use an AutoLoadOrThrow kind of function
			// so that either there will be success or a message to throw, and load will be
			// attempted only once respecting the auto-loading options
			ExtensionHelper::LoadExternalExtension(context, options.db_type);
		}
		return;
	}
}